

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS
ref_metric_gradation_at_complexity
          (REF_DBL *metric,REF_GRID ref_grid,REF_DBL gradation,REF_DBL complexity)

{
  uint uVar1;
  long lVar2;
  double dVar3;
  REF_NODE local_98;
  double local_88;
  REF_NODE local_80;
  double local_70;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT i;
  REF_INT node;
  REF_DBL complexity_scale;
  REF_DBL current_complexity;
  REF_NODE pRStack_38;
  REF_INT relaxations;
  REF_NODE ref_node;
  REF_DBL complexity_local;
  REF_DBL gradation_local;
  REF_GRID ref_grid_local;
  REF_DBL *metric_local;
  
  pRStack_38 = ref_grid->node;
  _i = 0.6666666666666666;
  if (ref_grid->twod != 0) {
    _i = 1.0;
  }
  current_complexity._4_4_ = 0;
  ref_node = (REF_NODE)complexity;
  complexity_local = gradation;
  gradation_local = (REF_DBL)ref_grid;
  ref_grid_local = (REF_GRID)metric;
  while( true ) {
    if (0x13 < current_complexity._4_4_) {
      uVar1 = ref_metric_complexity
                        ((REF_DBL *)ref_grid_local,(REF_GRID)gradation_local,&complexity_scale);
      if (uVar1 == 0) {
        if (complexity_scale * 1e+20 <= 0.0) {
          local_88 = -(complexity_scale * 1e+20);
        }
        else {
          local_88 = complexity_scale * 1e+20;
        }
        if ((double)ref_node <= 0.0) {
          local_98 = (REF_NODE)((ulong)ref_node ^ 0x8000000000000000);
        }
        else {
          local_98 = ref_node;
        }
        if ((double)local_98 < local_88) {
          for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < pRStack_38->max;
              ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
            if (((-1 < ref_private_macro_code_rss) && (ref_private_macro_code_rss < pRStack_38->max)
                ) && (-1 < pRStack_38->global[ref_private_macro_code_rss])) {
              for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 6;
                  ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
                dVar3 = pow((double)ref_node / complexity_scale,_i);
                lVar2 = (long)(ref_private_macro_code_rss_1 + ref_private_macro_code_rss * 6);
                ref_grid_local->cell[lVar2 + -2] =
                     (REF_CELL)(dVar3 * (double)ref_grid_local->cell[lVar2 + -2]);
              }
              if (*(int *)((long)gradation_local + 0x108) != 0) {
                ref_grid_local->cell[(long)(ref_private_macro_code_rss * 6 + 2) + -2] =
                     (REF_CELL)0x0;
                ref_grid_local->cell[(long)(ref_private_macro_code_rss * 6 + 4) + -2] =
                     (REF_CELL)0x0;
                ref_grid_local->cell[(long)(ref_private_macro_code_rss * 6 + 5) + -2] =
                     (REF_CELL)0x3ff0000000000000;
              }
            }
          }
          metric_local._4_4_ = 0;
        }
        else {
          metric_local._4_4_ = 4;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x45c,"ref_metric_gradation_at_complexity",(ulong)uVar1,"cmp");
        metric_local._4_4_ = uVar1;
      }
      return metric_local._4_4_;
    }
    uVar1 = ref_metric_complexity
                      ((REF_DBL *)ref_grid_local,(REF_GRID)gradation_local,&complexity_scale);
    if (uVar1 != 0) break;
    if (complexity_scale * 1e+20 <= 0.0) {
      local_70 = -(complexity_scale * 1e+20);
    }
    else {
      local_70 = complexity_scale * 1e+20;
    }
    if ((double)ref_node <= 0.0) {
      local_80 = (REF_NODE)((ulong)ref_node ^ 0x8000000000000000);
    }
    else {
      local_80 = ref_node;
    }
    if (local_70 <= (double)local_80) {
      if (*(int *)(*(long *)gradation_local + 4) == 0) {
        printf("div zero target %.18e current %.18e\n",ref_node,complexity_scale);
      }
      return 4;
    }
    for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < pRStack_38->max;
        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
      if (((-1 < ref_private_macro_code_rss) && (ref_private_macro_code_rss < pRStack_38->max)) &&
         (-1 < pRStack_38->global[ref_private_macro_code_rss])) {
        for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 6;
            ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
          dVar3 = pow((double)ref_node / complexity_scale,_i);
          lVar2 = (long)(ref_private_macro_code_rss_1 + ref_private_macro_code_rss * 6);
          ref_grid_local->cell[lVar2 + -2] =
               (REF_CELL)(dVar3 * (double)ref_grid_local->cell[lVar2 + -2]);
        }
        if (*(int *)((long)gradation_local + 0x108) != 0) {
          ref_grid_local->cell[(long)(ref_private_macro_code_rss * 6 + 2) + -2] = (REF_CELL)0x0;
          ref_grid_local->cell[(long)(ref_private_macro_code_rss * 6 + 4) + -2] = (REF_CELL)0x0;
          ref_grid_local->cell[(long)(ref_private_macro_code_rss * 6 + 5) + -2] =
               (REF_CELL)0x3ff0000000000000;
        }
      }
    }
    if (1.0 <= complexity_local) {
      uVar1 = ref_metric_metric_space_gradation
                        ((REF_DBL *)ref_grid_local,(REF_GRID)gradation_local,complexity_local);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x452,"ref_metric_gradation_at_complexity",(ulong)uVar1,"gradation");
        return uVar1;
      }
    }
    else {
      uVar1 = ref_metric_mixed_space_gradation
                        ((REF_DBL *)ref_grid_local,(REF_GRID)gradation_local,-1.0,-1.0);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x44f,"ref_metric_gradation_at_complexity",(ulong)uVar1,"gradation");
        return uVar1;
      }
    }
    if (*(int *)((long)gradation_local + 0x108) != 0) {
      for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < pRStack_38->max;
          ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
        if (((-1 < ref_private_macro_code_rss) && (ref_private_macro_code_rss < pRStack_38->max)) &&
           (-1 < pRStack_38->global[ref_private_macro_code_rss])) {
          ref_grid_local->cell[(long)(ref_private_macro_code_rss * 6 + 2) + -2] = (REF_CELL)0x0;
          ref_grid_local->cell[(long)(ref_private_macro_code_rss * 6 + 4) + -2] = (REF_CELL)0x0;
          ref_grid_local->cell[(long)(ref_private_macro_code_rss * 6 + 5) + -2] =
               (REF_CELL)0x3ff0000000000000;
        }
      }
    }
    current_complexity._4_4_ = current_complexity._4_4_ + 1;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x43b,
         "ref_metric_gradation_at_complexity",(ulong)uVar1,"cmp");
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_metric_gradation_at_complexity(REF_DBL *metric,
                                                      REF_GRID ref_grid,
                                                      REF_DBL gradation,
                                                      REF_DBL complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT relaxations;
  REF_DBL current_complexity;
  REF_DBL complexity_scale;
  REF_INT node, i;

  complexity_scale = 2.0 / 3.0;
  if (ref_grid_twod(ref_grid)) {
    complexity_scale = 1.0;
  }

  for (relaxations = 0; relaxations < 20; relaxations++) {
    RSS(ref_metric_complexity(metric, ref_grid, &current_complexity), "cmp");
    if (!ref_math_divisible(complexity, current_complexity)) {
      if (ref_mpi_once(ref_grid_mpi(ref_grid)))
        printf("div zero target %.18e current %.18e\n", complexity,
               current_complexity);
      return REF_DIV_ZERO;
    }
    each_ref_node_valid_node(ref_node, node) {
      for (i = 0; i < 6; i++) {
        metric[i + 6 * node] *=
            pow(complexity / current_complexity, complexity_scale);
      }
      if (ref_grid_twod(ref_grid)) {
        metric[2 + 6 * node] = 0.0;
        metric[4 + 6 * node] = 0.0;
        metric[5 + 6 * node] = 1.0;
      }
    }
    if (gradation < 1.0) {
      RSS(ref_metric_mixed_space_gradation(metric, ref_grid, -1.0, -1.0),
          "gradation");
    } else {
      RSS(ref_metric_metric_space_gradation(metric, ref_grid, gradation),
          "gradation");
    }
    if (ref_grid_twod(ref_grid)) {
      each_ref_node_valid_node(ref_node, node) {
        metric[2 + 6 * node] = 0.0;
        metric[4 + 6 * node] = 0.0;
        metric[5 + 6 * node] = 1.0;
      }
    }
  }
  RSS(ref_metric_complexity(metric, ref_grid, &current_complexity), "cmp");
  if (!ref_math_divisible(complexity, current_complexity)) {
    return REF_DIV_ZERO;
  }
  each_ref_node_valid_node(ref_node, node) {
    for (i = 0; i < 6; i++) {
      metric[i + 6 * node] *=
          pow(complexity / current_complexity, complexity_scale);
    }
    if (ref_grid_twod(ref_grid)) {
      metric[2 + 6 * node] = 0.0;
      metric[4 + 6 * node] = 0.0;
      metric[5 + 6 * node] = 1.0;
    }
  }

  return REF_SUCCESS;
}